

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_player_prop_bindui(parser *p)

{
  bool bVar1;
  wchar_t wVar2;
  int iVar3;
  char *pcVar4;
  char *__s1;
  void *pvVar5;
  undefined8 *p_00;
  long lVar6;
  char *end;
  char *local_30;
  
  pcVar4 = parser_getsym(p,"ui");
  __s1 = parser_getsym(p,"uival");
  wVar2 = parser_getint(p,"aux");
  pvVar5 = parser_priv(p);
  if (pvVar5 == (void *)0x0) {
    return PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  p_00 = (undefined8 *)mem_alloc(0x18);
  pcVar4 = string_make(pcVar4);
  *p_00 = pcVar4;
  iVar3 = strcmp(__s1,"special");
  if (iVar3 == 0) {
    *(undefined4 *)(p_00 + 2) = 0;
    *(undefined1 *)((long)p_00 + 0x15) = 1;
    goto LAB_00166b47;
  }
  lVar6 = strtol(__s1,&local_30,10);
  if ((*__s1 == '\0') || (*local_30 != '\0')) {
    string_free((char *)*p_00);
    mem_free(p_00);
    lVar6 = 0x33;
LAB_00166b2b:
    bVar1 = false;
  }
  else {
    if (lVar6 - 0x7fffffffU < 0xffffffff00000002) {
      string_free((char *)*p_00);
      mem_free(p_00);
      lVar6 = 0x25;
      goto LAB_00166b2b;
    }
    *(int *)(p_00 + 2) = (int)lVar6;
    *(undefined1 *)((long)p_00 + 0x15) = 0;
    bVar1 = true;
  }
  if (!bVar1) {
    return (parser_error)lVar6;
  }
LAB_00166b47:
  *(bool *)((long)p_00 + 0x14) = wVar2 != L'\0';
  p_00[1] = *(undefined8 *)((long)pvVar5 + 0x30);
  *(undefined8 **)((long)pvVar5 + 0x30) = p_00;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_player_prop_bindui(struct parser *p) {
	const char *name = parser_getsym(p, "ui");
	const char *value = parser_getsym(p, "uival");
	bool isaux = (parser_getint(p, "aux") != 0);
	struct embryo_player_ability *embryo = parser_priv(p);
	struct player_bound_ui *boundui;
	if (!embryo)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	boundui = mem_alloc(sizeof(*boundui));
	boundui->name = string_make(name);
	if (streq(value, "special")) {
		boundui->value = 0;
		boundui->isspecial = true;
	} else {
		long v;
		char* end;

		v = strtol(value, &end, 10);
		if (! *value || *end) {
			string_free(boundui->name);
			mem_free(boundui);
			return PARSE_ERROR_NOT_NUMBER;
		}
		/*
		 * Also reject INT_MIN and INT_MAX so we don't have to check
		 * errno to detect out of range values on platforms where
		 * sizeof(int) == sizeof(long).
		 */
		if (v <= INT_MIN || v >= INT_MAX) {
			string_free(boundui->name);
			mem_free(boundui);
			return PARSE_ERROR_INVALID_VALUE;
		}
		boundui->value = (int) v;
		boundui->isspecial = false;
	}
	boundui->isaux = isaux;
	boundui->next = embryo->boundui;
	embryo->boundui = boundui;
	return PARSE_ERROR_NONE;
}